

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O0

bool ncnn::test_prefer_winograd63(int num_input,int num_output,int w,int h)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  int in_EDI;
  int minwh;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  bool local_1;
  
  local_c = in_ESI;
  local_8 = in_EDI;
  piVar2 = std::min<int>(&local_10,&local_14);
  iVar1 = *piVar2;
  if (local_8 < 0x40) {
    if (local_8 < 0x20) {
      if (local_8 < 0x10) {
        if (local_8 < 8) {
          local_1 = false;
        }
        else if (local_c < 0x40) {
          if (local_c < 0x20) {
            if (local_c < 0x10) {
              if (local_c < 8) {
                local_1 = false;
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_27 = true;
              if (((iVar1 != 0x1f) && (local_27 = true, iVar1 != 0x20)) &&
                 ((iVar1 < 0x27 || (local_27 = true, 0x2c < iVar1)))) {
                local_28 = 0x2e < iVar1 && iVar1 < 0xd5;
                local_27 = local_28;
              }
              local_1 = local_27;
            }
          }
          else {
            if ((((iVar1 < 7) || (local_25 = true, 0xe < iVar1)) &&
                (((iVar1 < 0x11 || (local_25 = true, 0x14 < iVar1)) &&
                 ((iVar1 < 0x17 || (local_25 = true, 0x1a < iVar1)))))) &&
               ((iVar1 < 0x1f || (local_25 = true, 0x26 < iVar1)))) {
              local_26 = 0x2a < iVar1 && iVar1 < 0xa3;
              local_25 = local_26;
            }
            local_1 = local_25;
          }
        }
        else {
          local_1 = false;
        }
      }
      else if (local_c < 0x40) {
        if (local_c < 0x20) {
          if (local_c < 0x10) {
            if (local_c < 8) {
              local_1 = false;
            }
            else {
              if (((((iVar1 < 0x13) || (local_23 = true, 0x14 < iVar1)) &&
                   ((iVar1 < 0x21 || (local_23 = true, 0x26 < iVar1)))) &&
                  ((iVar1 < 0x2b || (local_23 = true, 0x2c < iVar1)))) &&
                 ((iVar1 < 0x2f || (local_23 = true, 0x80 < iVar1)))) {
                local_24 = 0x9a < iVar1 && iVar1 < 0xd3;
                local_23 = local_24;
              }
              local_1 = local_23;
            }
          }
          else {
            if (((((iVar1 < 0xb) || (local_21 = true, 0xe < iVar1)) &&
                 ((iVar1 < 0x1b || (local_21 = true, 0x26 < iVar1)))) &&
                ((iVar1 < 0x2b || (local_21 = true, 0x2c < iVar1)))) &&
               (((iVar1 < 0x2f || (local_21 = true, 0x4a < iVar1)) &&
                (((iVar1 < 0x51 || (local_21 = true, 0x6e < iVar1)) &&
                 ((iVar1 < 0x75 || (local_21 = true, 0xaa < iVar1)))))))) {
              local_22 = 0xb0 < iVar1 && iVar1 < 0xb7;
              local_21 = local_22;
            }
            local_1 = local_21;
          }
        }
        else {
          if ((((iVar1 < 0xb) || (local_1f = true, 0xe < iVar1)) &&
              ((iVar1 < 0x13 || (local_1f = true, 0x14 < iVar1)))) &&
             (((iVar1 < 0x17 || (local_1f = true, 0x2c < iVar1)) &&
              ((iVar1 < 0x2f || (local_1f = true, 0x5c < iVar1)))))) {
            local_20 = 0x5e < iVar1 && iVar1 < 0xbd;
            local_1f = local_20;
          }
          local_1 = local_1f;
        }
      }
      else {
        local_1 = false;
      }
    }
    else if (local_c < 0x40) {
      if (local_c < 0x20) {
        if (local_c < 0x10) {
          if (local_c < 8) {
            local_1 = false;
          }
          else {
            if (((((iVar1 < 0xb) || (local_1d = true, 0xe < iVar1)) &&
                 ((iVar1 < 0x13 || (local_1d = true, 0x14 < iVar1)))) &&
                ((iVar1 < 0x1f || (local_1d = true, 0x26 < iVar1)))) &&
               ((iVar1 < 0x2b || (local_1d = true, 0x2c < iVar1)))) {
              local_1e = 0x36 < iVar1 && iVar1 < 0xa3;
              local_1d = local_1e;
            }
            local_1 = local_1d;
          }
        }
        else {
          if ((((iVar1 < 0xd) || (local_1b = true, 0xe < iVar1)) &&
              ((iVar1 < 0x13 || (local_1b = true, 0x14 < iVar1)))) &&
             (((iVar1 < 0x17 || (local_1b = true, 0x26 < iVar1)) &&
              ((iVar1 < 0x2b || (local_1b = true, 0x2c < iVar1)))))) {
            local_1c = 0x2e < iVar1 && iVar1 < 0x8d;
            local_1b = local_1c;
          }
          local_1 = local_1b;
        }
      }
      else {
        if (((((iVar1 < 0xb) || (local_19 = true, 0xe < iVar1)) &&
             ((iVar1 < 0x13 || (local_19 = true, 0x14 < iVar1)))) &&
            ((iVar1 < 0x17 || (local_19 = true, 0x2c < iVar1)))) &&
           ((iVar1 < 0x2f || (local_19 = true, 0x38 < iVar1)))) {
          local_1a = 0x3e < iVar1 && iVar1 < 0x83;
          local_19 = local_1a;
        }
        local_1 = local_19;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool test_prefer_winograd63(int num_input, int num_output, int w, int h)
{
    // winograd selection strategy (profiled on i7-7700 single thread)

    int minwh = std::min(w, h);

    if (num_input >= 64)
    {
        return false;
    }
    if (num_input >= 32)
    {
        if (num_output >= 64) return false;
        if (num_output >= 32) return (minwh >= 11 && minwh <= 14)
                                         || (minwh >= 19 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 56)
                                         || (minwh >= 63 && minwh <= 130);
        if (num_output >= 16) return (minwh >= 13 && minwh <= 14)
                                         || (minwh >= 19 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 38)
                                         || (minwh >= 43 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 140);
        if (num_output >= 8) return (minwh >= 11 && minwh <= 14)
                                        || (minwh >= 19 && minwh <= 20)
                                        || (minwh >= 31 && minwh <= 38)
                                        || (minwh >= 43 && minwh <= 44)
                                        || (minwh >= 55 && minwh <= 162);
        return false;
    }
    if (num_input >= 16)
    {
        if (num_output >= 64) return false;
        if (num_output >= 32) return (minwh >= 11 && minwh <= 14)
                                         || (minwh >= 19 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 92)
                                         || (minwh >= 95 && minwh <= 188);
        if (num_output >= 16) return (minwh >= 11 && minwh <= 14)
                                         || (minwh >= 27 && minwh <= 38)
                                         || (minwh >= 43 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 74)
                                         || (minwh >= 81 && minwh <= 110)
                                         || (minwh >= 117 && minwh <= 170)
                                         || (minwh >= 177 && minwh <= 182);
        if (num_output >= 8) return (minwh >= 19 && minwh <= 20)
                                        || (minwh >= 33 && minwh <= 38)
                                        || (minwh >= 43 && minwh <= 44)
                                        || (minwh >= 47 && minwh <= 128)
                                        || (minwh >= 155 && minwh <= 210);
        return false;
    }
    if (num_input >= 8)
    {
        if (num_output >= 64) return false;
        if (num_output >= 32) return (minwh >= 7 && minwh <= 14)
                                         || (minwh >= 17 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 26)
                                         || (minwh >= 31 && minwh <= 38)
                                         || (minwh >= 43 && minwh <= 162);
        if (num_output >= 16) return minwh == 31 || minwh == 32
                                         || (minwh >= 39 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 212);
        if (num_output >= 8) return false;
        return false;
    }

    return false;
}